

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O2

bool __thiscall
rapidjson::internal::
GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::AddState(GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
           *this,Stack<rapidjson::CrtAllocator> *l,SizeType index)

{
  uint uVar1;
  bool bVar2;
  State *pSVar3;
  uint *puVar4;
  byte bVar5;
  
  bVar5 = 0;
  while( true ) {
    if (index == 0xffffffff) {
      __assert_fail("index != kRegexInvalidState",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                    ,0x2b4,
                    "bool rapidjson::internal::GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<>>>::AddState(Stack<Allocator> &, SizeType) [RegexType = rapidjson::internal::GenericRegex<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                   );
    }
    pSVar3 = GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetState
                       (this->regex_,index);
    if (pSVar3->out1 == 0xffffffff) break;
    bVar2 = AddState(this,l,pSVar3->out);
    index = pSVar3->out1;
    bVar5 = bVar5 | bVar2;
  }
  uVar1 = this->stateSet_[index >> 5];
  if ((uVar1 >> (index & 0x1f) & 1) == 0) {
    this->stateSet_[index >> 5] = uVar1 | 1 << ((byte)index & 0x1f);
    puVar4 = Stack<rapidjson::CrtAllocator>::PushUnsafe<unsigned_int>(l,1);
    *puVar4 = index;
  }
  return (bool)(bVar5 | pSVar3->out == 0xffffffff);
}

Assistant:

bool AddState(Stack<Allocator>& l, SizeType index) {
        RAPIDJSON_ASSERT(index != kRegexInvalidState);

        const State& s = regex_.GetState(index);
        if (s.out1 != kRegexInvalidState) { // Split
            bool matched = AddState(l, s.out);
            return AddState(l, s.out1) || matched;
        }
        else if (!(stateSet_[index >> 5] & (1u << (index & 31)))) {
            stateSet_[index >> 5] |= (1u << (index & 31));
            *l.template PushUnsafe<SizeType>() = index;
        }
        return s.out == kRegexInvalidState; // by using PushUnsafe() above, we can ensure s is not validated due to reallocation.
    }